

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_overwrite_int32(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  cVar1 = bson_append_int32(local_180,"key",0xffffffffffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_int32 (&b, \"key\", -1, 1234)";
    uVar3 = 0x18d;
  }
  else {
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
      uVar3 = 0x18e;
    }
    else {
      iVar2 = bson_iter_type(auStack_200);
      if (iVar2 == 0x10) {
        bson_iter_overwrite_int32(auStack_200,0x10e1);
        cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
        if (cVar1 == '\0') {
          pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
          uVar3 = 0x191;
        }
        else {
          iVar2 = bson_iter_type(auStack_200);
          if (iVar2 == 0x10) {
            iVar2 = bson_iter_int32(auStack_200);
            if (iVar2 == 0x10e1) {
              bson_destroy(local_180);
              return;
            }
            fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)bson_iter_int32 (&iter) == 4321\n",
                    0x193);
            abort();
          }
          pcVar4 = "BSON_ITER_HOLDS_INT32 (&iter)";
          uVar3 = 0x192;
        }
      }
      else {
        pcVar4 = "BSON_ITER_HOLDS_INT32 (&iter)";
        uVar3 = 399;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_overwrite_int32",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_overwrite_int32 (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_int32 (&b, "key", -1, 1234));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT32 (&iter));
   bson_iter_overwrite_int32 (&iter, 4321);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT32 (&iter));
   BSON_ASSERT_CMPINT (bson_iter_int32 (&iter), ==, 4321);
   bson_destroy (&b);
}